

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headergen.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  fout f_00;
  int iVar1;
  rnndb *db_00;
  size_t sVar2;
  char *pcVar3;
  FILE *pFVar4;
  ushort **ppuVar5;
  fout *pfVar6;
  int local_64;
  int local_60;
  int j_3;
  int j_2;
  int j_1;
  fout f;
  char *pretty;
  char *dstname;
  int local_28;
  int ret;
  int j;
  int i;
  rnndb *db;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    fprintf(_stderr,"Usage:\n\theadergen database-file\n");
    exit(1);
  }
  rnn_init();
  db_00 = rnn_newdb();
  rnn_parsefile(db_00,argv[1]);
  rnn_prepdb(db_00);
  ret = 0;
  while( true ) {
    if (db_00->filesnum <= ret) {
      for (ret = 0; ret < db_00->enumsnum; ret = ret + 1) {
        if (db_00->enums[ret]->isinline == 0) {
          for (j_3 = 0; j_3 < db_00->enums[ret]->valsnum; j_3 = j_3 + 1) {
            printvalue(db_00->enums[ret]->vals[j_3],0);
          }
        }
      }
      for (ret = 0; ret < db_00->bitsetsnum; ret = ret + 1) {
        if (db_00->bitsets[ret]->isinline == 0) {
          for (local_60 = 0; local_60 < db_00->bitsets[ret]->bitfieldsnum; local_60 = local_60 + 1)
          {
            printbitfield(db_00->bitsets[ret]->bitfields[local_60],0);
          }
        }
      }
      for (ret = 0; ret < db_00->domainsnum; ret = ret + 1) {
        if (db_00->domains[ret]->size != 0) {
          printdef(db_00->domains[ret]->fullname,"SIZE",0,db_00->domains[ret]->size,
                   db_00->domains[ret]->file);
        }
        for (local_64 = 0; local_64 < db_00->domains[ret]->subelemsnum; local_64 = local_64 + 1) {
          printdelem(db_00->domains[ret]->subelems[local_64],0);
        }
      }
      for (ret = 0; ret < foutsnum; ret = ret + 1) {
        fprintf((FILE *)fouts[ret].file,"\n#endif /* %s */\n",fouts[ret].guard);
      }
      iVar1 = db_00->estatus;
      rnn_freedb(db_00);
      rnn_fini();
      return iVar1;
    }
    sVar2 = strlen(db_00->files[ret]);
    pcVar3 = (char *)malloc(sVar2 + 3);
    strcpy(pcVar3,db_00->files[ret]);
    strcat(pcVar3,".h");
    __s = db_00->files[ret];
    pFVar4 = fopen(pcVar3,"w");
    if (pFVar4 == (FILE *)0x0) break;
    free(pcVar3);
    pcVar3 = strrchr(__s,0x2f);
    f.guard = __s;
    if (pcVar3 != (char *)0x0) {
      f.guard = pcVar3 + 1;
    }
    pcVar3 = strdup(f.guard);
    for (local_28 = 0; sVar2 = strlen(pcVar3), (ulong)(long)local_28 < sVar2;
        local_28 = local_28 + 1) {
      ppuVar5 = __ctype_b_loc();
      if (((*ppuVar5)[(int)pcVar3[local_28]] & 8) == 0) {
        pcVar3[local_28] = '_';
      }
      else {
        iVar1 = toupper((int)pcVar3[local_28]);
        pcVar3[local_28] = (char)iVar1;
      }
    }
    if (foutsmax <= foutsnum) {
      if (foutsmax == 0) {
        foutsmax = 0x10;
      }
      else {
        foutsmax = foutsmax << 1;
      }
      fouts = (fout *)realloc(fouts,(long)foutsmax * 0x18);
    }
    pfVar6 = fouts + foutsnum;
    foutsnum = foutsnum + 1;
    pfVar6->name = __s;
    pfVar6->file = (FILE *)pFVar4;
    pfVar6->guard = pcVar3;
    f_00.file = (FILE *)pFVar4;
    f_00.name = __s;
    f_00.guard = pcVar3;
    printhead(f_00,db_00);
    ret = ret + 1;
  }
  perror(pcVar3);
  exit(1);
}

Assistant:

int main(int argc, char **argv) {
	struct rnndb *db;
	int i, j, ret;

	if (argc < 2) {
		fprintf(stderr, "Usage:\n\theadergen database-file\n");
		exit(1);
	}

	rnn_init();
	db = rnn_newdb();
	rnn_parsefile (db, argv[1]);
	rnn_prepdb (db);
	for(i = 0; i < db->filesnum; ++i) {
		char *dstname = malloc(strlen(db->files[i]) + 3);
		char *pretty;
		strcpy(dstname, db->files[i]);
		strcat(dstname, ".h");
		struct fout f = { db->files[i], fopen(dstname, "w") };
		if (!f.file) {
			perror(dstname);
			exit(1);
		}
		free(dstname);
		pretty = strrchr(f.name, '/');
		if (pretty)
			pretty += 1;
		else
			pretty = f.name;
		f.guard = strdup(pretty);
		for (j = 0; j < strlen(f.guard); j++)
			if (isalnum(f.guard[j]))
				f.guard[j] = toupper(f.guard[j]);
			else
				f.guard[j] = '_';
		ADDARRAY(fouts, f);
		printhead(f, db);
	}

	for (i = 0; i < db->enumsnum; i++) {
		if (db->enums[i]->isinline)
			continue;
		int j;
		for (j = 0; j < db->enums[i]->valsnum; j++)
			printvalue (db->enums[i]->vals[j], 0);
	}
	for (i = 0; i < db->bitsetsnum; i++) {
		if (db->bitsets[i]->isinline)
			continue;
		int j;
		for (j = 0; j < db->bitsets[i]->bitfieldsnum; j++)
			printbitfield (db->bitsets[i]->bitfields[j], 0);
	}
	for (i = 0; i < db->domainsnum; i++) {
		if (db->domains[i]->size)
			printdef (db->domains[i]->fullname, "SIZE", 0, db->domains[i]->size, db->domains[i]->file);
		int j;
		for (j = 0; j < db->domains[i]->subelemsnum; j++) {
			printdelem(db->domains[i]->subelems[j], 0);
		}
	}
	for(i = 0; i < foutsnum; ++i) {
		fprintf (fouts[i].file, "\n#endif /* %s */\n", fouts[i].guard);
	}
	ret = db->estatus;

	rnn_freedb(db);
	rnn_fini();

	return ret;
}